

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void __thiscall
TestCase::TestFailedInternal(TestCase *this,char *filename,int line_num,char *fmt,...)

{
  char in_AL;
  Thread *this_00;
  ulong uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list params;
  char *fmt_local;
  int line_num_local;
  char *filename_local;
  TestCase *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_d8 = in_R8;
  local_d0 = in_R9;
  Mutex::Lock();
  std::__cxx11::string::operator=((string *)&this->mFilename,filename);
  this->mLineNumber = line_num;
  params[0].overflow_arg_area = local_f8;
  params[0]._0_8_ = &stack0x00000008;
  local_48._4_4_ = 0x30;
  local_48._0_4_ = 0x20;
  JetHead::stl_vsprintf<std::__cxx11::string>(&this->mErrorString,fmt,(__va_list_tag *)local_48);
  if ((this->mTestComplete & 1U) != 0) {
    printf(" BAD TEST CASE, TestPassed/TestFailed already called\n");
  }
  this->mTestComplete = true;
  this->mTestPassed = false;
  Mutex::Unlock();
  this_00 = (Thread *)JHThread::Thread::GetCurrent();
  uVar1 = JHThread::Thread::operator==(this_00,&(this->mThread).super_Thread);
  if ((uVar1 & 1) == 0) {
    JHThread::Thread::Stop();
  }
  else {
    JHThread::Thread::Exit();
  }
  return;
}

Assistant:

void TestFailedInternal( const char *filename, int line_num, const char *fmt, ... ) __attribute__ ((__format__ (__printf__, 4, 5)))
	{
		va_list params;

		mMutex.Lock();

		mFilename = filename;
		mLineNumber = line_num;
		
		va_start( params, fmt );
		JetHead::stl_vsprintf( mErrorString, fmt, params );
		va_end( params );

		if ( mTestComplete )
			printf( " BAD TEST CASE, TestPassed/TestFailed already called\n" );

		mTestComplete = true;
		mTestPassed = false;
		mMutex.Unlock();
		
		if ( *(Thread::GetCurrent()) == mThread )
			Thread::Exit();
		else
			mThread.Stop();
	}